

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::SkipMessage
               (CodedInputStream *input,CodedOutputStream *output)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  byte *pbVar6;
  ulong uVar7;
  byte unaff_BPL;
  uint uVar8;
  
  do {
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar7 = (ulong)bVar1;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_002c918d;
      input->last_tag_ = (uint)bVar1;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar4 = 0;
LAB_002c918d:
      uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = (ulong)uVar4;
      input->last_tag_ = uVar4;
    }
    uVar4 = (uint32)uVar7;
    if (uVar4 == 0) {
LAB_002c920c:
      bVar3 = false;
      unaff_BPL = true;
    }
    else {
      if ((uVar4 & 7) == 4) {
        if (output->buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(output,uVar4);
        }
        else {
          pbVar2 = output->buffer_;
          pbVar6 = pbVar2;
          if (0x7f < uVar4) {
            do {
              uVar8 = (uint)uVar7;
              *pbVar6 = (byte)uVar7 | 0x80;
              uVar7 = uVar7 >> 7;
              pbVar6 = pbVar6 + 1;
            } while (0x3fff < uVar8);
          }
          *pbVar6 = (byte)uVar7;
          iVar5 = ((int)pbVar6 - (int)pbVar2) + 1;
          output->buffer_ = output->buffer_ + iVar5;
          output->buffer_size_ = output->buffer_size_ - iVar5;
        }
        goto LAB_002c920c;
      }
      bVar3 = SkipField(input,uVar4,output);
      unaff_BPL = unaff_BPL & bVar3;
    }
    if (bVar3 == false) {
      return (bool)unaff_BPL;
    }
  } while( true );
}

Assistant:

bool WireFormatLite::SkipMessage(io::CodedInputStream* input,
    io::CodedOutputStream* output) {
  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      output->WriteVarint32(tag);
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag, output)) return false;
  }
}